

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DB::Open(DB *this,Options *options,string *dbname,DB **dbptr)

{
  Env *pEVar1;
  bool bVar2;
  DBImpl *this_00;
  Writer *this_01;
  MemTable *this_02;
  undefined1 local_120 [56];
  WritableFile *lfile;
  uint64_t new_log_number;
  undefined1 local_d8 [7];
  bool save_manifest;
  VersionEdit edit;
  DBImpl *impl;
  DB **dbptr_local;
  string *dbname_local;
  Options *options_local;
  Status *s;
  
  *dbptr = (DB *)0x0;
  this_00 = (DBImpl *)operator_new(0x2e0);
  DBImpl::DBImpl(this_00,options,dbname);
  edit.new_files_.
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
  port::Mutex::Lock(&this_00->mutex_);
  VersionEdit::VersionEdit((VersionEdit *)local_d8);
  new_log_number._7_1_ = 0;
  new_log_number._6_1_ = 0;
  DBImpl::Recover((DBImpl *)this,
                  (VersionEdit *)
                  edit.new_files_.
                  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)local_d8);
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) &&
     (edit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.number == 0)) {
    lfile = (WritableFile *)
            VersionSet::NewFileNumber
                      ((VersionSet *)
                       edit.new_files_.
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[5].second.largest.rep_.
                       _M_string_length);
    pEVar1 = options->env;
    LogFileName((string *)(local_120 + 8),dbname,(uint64_t)lfile);
    (*pEVar1->_vptr_Env[4])(local_120 + 0x28,pEVar1,local_120 + 8,local_120 + 0x30);
    Status::operator=((Status *)this,(Status *)(local_120 + 0x28));
    Status::~Status((Status *)(local_120 + 0x28));
    std::__cxx11::string::~string((string *)(local_120 + 8));
    bVar2 = Status::ok((Status *)this);
    if (bVar2) {
      VersionEdit::SetLogNumber((VersionEdit *)local_d8,(uint64_t)lfile);
      edit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.smallest.rep_._M_string_length =
           local_120._48_8_;
      edit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.smallest.rep_.field_2.
      _M_allocated_capacity = (size_type)lfile;
      this_01 = (Writer *)operator_new(0x20);
      log::Writer::Writer(this_01,(WritableFile *)local_120._48_8_);
      *(Writer **)
       ((long)&edit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.smallest.rep_.field_2 +
       8) = this_01;
      this_02 = (MemTable *)operator_new(0x70);
      MemTable::MemTable(this_02,(InternalKeyComparator *)
                                 &((edit.new_files_.
                                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->second).
                                  number);
      edit.new_files_.
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.number = (uint64_t)this_02;
      MemTable::Ref((MemTable *)
                    edit.new_files_.
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.number);
    }
  }
  bVar2 = Status::ok((Status *)this);
  if ((bVar2) && ((new_log_number._7_1_ & 1) != 0)) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)local_d8,0);
    VersionEdit::SetLogNumber
              ((VersionEdit *)local_d8,
               edit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.smallest.rep_.field_2.
               _M_allocated_capacity);
    VersionSet::LogAndApply
              ((VersionSet *)local_120,
               (VersionEdit *)
               edit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[5].second.largest.rep_.
               _M_string_length,(Mutex *)local_d8);
    Status::operator=((Status *)this,(Status *)local_120);
    Status::~Status((Status *)local_120);
  }
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    DBImpl::RemoveObsoleteFiles
              ((DBImpl *)
               edit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    DBImpl::MaybeScheduleCompaction
              ((DBImpl *)
               edit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  port::Mutex::Unlock((Mutex *)&edit.new_files_.
                                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[2].second);
  bVar2 = Status::ok((Status *)this);
  if (bVar2) {
    if (edit.new_files_.
        super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[3].second.number == 0) {
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                    ,0x5f6,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *dbptr = (DB *)edit.new_files_.
                   super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else if (edit.new_files_.
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (**(code **)(*(long *)edit.new_files_.
                          super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 8))();
  }
  new_log_number._6_1_ = 1;
  VersionEdit::~VersionEdit((VersionEdit *)local_d8);
  return (Status)(char *)this;
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->RemoveObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}